

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_print.c
# Opt level: O0

void h264_print_seqparm(h264_seqparm *seqparm)

{
  uint32_t uVar1;
  h264_seqparm_mvc_applicable_op *phVar2;
  int iVar3;
  h264_seqparm_mvc_applicable_op *op;
  uint local_20;
  int k;
  int j;
  int i;
  char *profile_name;
  h264_seqparm *seqparm_local;
  
  printf("Sequence parameter set:\n");
  _j = "???";
  uVar1 = seqparm->profile_idc;
  if (uVar1 == 0x2c) {
    _j = "CAVLC 4:4:4";
  }
  else if (uVar1 == 0x42) {
    _j = "Baseline";
  }
  else if (uVar1 == 0x4d) {
    _j = "Main";
  }
  else if (uVar1 == 0x53) {
    _j = "Scalable Baseline";
  }
  else if (uVar1 == 0x56) {
    _j = "Scalable High";
  }
  else if (uVar1 == 0x58) {
    _j = "Extended";
  }
  else if (uVar1 == 100) {
    _j = "High";
  }
  else if (uVar1 == 0x6e) {
    _j = "High 10";
  }
  else if (uVar1 == 0x76) {
    _j = "Multiview High";
  }
  else if (uVar1 == 0x7a) {
    _j = "High 4:2:2";
  }
  else if (uVar1 == 0x80) {
    _j = "Stereo High";
  }
  else if (uVar1 == 0x90) {
    _j = "High 4:4:4";
  }
  else if (uVar1 == 0xf4) {
    _j = "High 4:4:4 Predictive";
  }
  printf("\tprofile_idc = %d [%s]\n",(ulong)seqparm->profile_idc,_j);
  printf("\tconstraint_set =");
  for (k = 7; -1 < k; k = k + -1) {
    printf(" %d",(ulong)(seqparm->constraint_set >> ((byte)k & 0x1f) & 1));
  }
  printf("\n");
  printf("\tlevel_idc = %d.%d\n",(ulong)seqparm->level_idc / 10,(ulong)seqparm->level_idc % 10);
  printf("\tseq_parameter_set_id = %d\n",(ulong)seqparm->seq_parameter_set_id);
  printf("\tchroma_format_idc = %d\n",(ulong)seqparm->chroma_format_idc);
  printf("\tseparate_colour_plane_flag = %d\n",(ulong)seqparm->separate_colour_plane_flag);
  printf("\tbit_depth_luma_minus8 = %d\n",(ulong)seqparm->bit_depth_luma_minus8);
  printf("\tbit_depth_chroma_minus8 = %d\n",(ulong)seqparm->bit_depth_chroma_minus8);
  printf("\tqpprime_y_zero_transform_bypass_flag = %d\n",
         (ulong)seqparm->qpprime_y_zero_transform_bypass_flag);
  printf("\tseq_scaling_matrix_present_flag = %d\n",(ulong)seqparm->seq_scaling_matrix_present_flag)
  ;
  if (seqparm->seq_scaling_matrix_present_flag != 0) {
    k = 0;
    while( true ) {
      iVar3 = 8;
      if (seqparm->chroma_format_idc == 3) {
        iVar3 = 0xc;
      }
      if (iVar3 <= k) break;
      printf("\tseq_scaling_list_present_flag[%d] = %d\n",(ulong)(uint)k,
             (ulong)seqparm->seq_scaling_list_present_flag[k]);
      if ((seqparm->seq_scaling_list_present_flag[k] != 0) &&
         (printf("\tuse_default_scaling_matrix_flag[%d] = %d\n",(ulong)(uint)k,
                 (ulong)seqparm->use_default_scaling_matrix_flag[k]),
         seqparm->use_default_scaling_matrix_flag[k] == 0)) {
        local_20 = 0;
        while( true ) {
          iVar3 = 0x40;
          if (k < 6) {
            iVar3 = 0x10;
          }
          if (iVar3 <= (int)local_20) break;
          if (k < 6) {
            printf("\tseq_scaling_list[%d][%d] = %d\n",(ulong)(uint)k,(ulong)local_20,
                   (ulong)seqparm->seq_scaling_list_4x4[k][(int)local_20]);
          }
          else {
            printf("\tseq_scaling_list[%d][%d] = %d\n",(ulong)(uint)k,(ulong)local_20,
                   (ulong)seqparm->seq_scaling_list_8x8[k + -6][(int)local_20]);
          }
          local_20 = local_20 + 1;
        }
      }
      k = k + 1;
    }
  }
  printf("\tlog2_max_frame_num_minus4 = %d\n",(ulong)seqparm->log2_max_frame_num_minus4);
  printf("\tpic_order_cnt_type = %d\n",(ulong)seqparm->pic_order_cnt_type);
  if (seqparm->pic_order_cnt_type == 0) {
    printf("\tlog2_max_pic_order_cnt_lsb_minus4 = %d\n",
           (ulong)seqparm->log2_max_pic_order_cnt_lsb_minus4);
  }
  else if (seqparm->pic_order_cnt_type == 1) {
    printf("\tdelta_pic_order_always_zero_flag = %d\n",
           (ulong)seqparm->delta_pic_order_always_zero_flag);
    printf("\toffset_for_non_ref_pic = %d\n",(ulong)(uint)seqparm->offset_for_non_ref_pic);
    printf("\toffset_for_top_to_bottom_field = %d\n",
           (ulong)(uint)seqparm->offset_for_top_to_bottom_field);
    printf("\tnum_ref_frames_in_pic_order_cnt_cycle = %d\n",
           (ulong)seqparm->num_ref_frames_in_pic_order_cnt_cycle);
    for (k = 0; (uint)k < seqparm->num_ref_frames_in_pic_order_cnt_cycle; k = k + 1) {
      printf("\toffset_for_ref_frame[%d] = %d\n",(ulong)(uint)k,
             (ulong)(uint)seqparm->offset_for_ref_frame[k]);
    }
  }
  printf("\tmax_num_ref_frames = %d\n",(ulong)seqparm->max_num_ref_frames);
  printf("\tgaps_in_frame_num_value_allowed_flag = %d\n",
         (ulong)seqparm->gaps_in_frame_num_value_allowed_flag);
  printf("\tpic_width_in_mbs_minus1 = %d\n",(ulong)seqparm->pic_width_in_mbs_minus1);
  printf("\tpic_height_in_map_units_minus1 = %d\n",(ulong)seqparm->pic_height_in_map_units_minus1);
  printf("\tframe_mbs_only_flag = %d\n",(ulong)seqparm->frame_mbs_only_flag);
  printf("\tmb_adaptive_frame_field_flag = %d\n",(ulong)seqparm->mb_adaptive_frame_field_flag);
  printf("\tdirect_8x8_inference_flag = %d\n",(ulong)seqparm->direct_8x8_inference_flag);
  printf("\tframe_cropping_flag = %d\n",(ulong)seqparm->frame_cropping_flag);
  printf("\tframe_crop_left_offset = %d\n",(ulong)seqparm->frame_crop_left_offset);
  printf("\tframe_crop_right_offset = %d\n",(ulong)seqparm->frame_crop_right_offset);
  printf("\tframe_crop_top_offset = %d\n",(ulong)seqparm->frame_crop_top_offset);
  printf("\tframe_crop_bottom_offset = %d\n",(ulong)seqparm->frame_crop_bottom_offset);
  if (seqparm->vui != (h264_vui *)0x0) {
    printf("\tVUI parameters:\n");
    printf("\t\taspect_ratio_present_flag = %d\n",(ulong)seqparm->vui->aspect_ratio_present_flag);
    printf("\t\taspect_ratio_idc = %d\n",(ulong)seqparm->vui->aspect_ratio_idc);
    printf("\t\tsar_width = %d\n",(ulong)seqparm->vui->sar_width);
    printf("\t\tsar_height = %d\n",(ulong)seqparm->vui->sar_height);
    printf("\t\toverscan_info_present_flag = %d\n",(ulong)seqparm->vui->overscan_info_present_flag);
    if (seqparm->vui->overscan_info_present_flag != 0) {
      printf("\t\toverscan_appropriate_flag = %d\n",(ulong)seqparm->vui->overscan_appropriate_flag);
    }
    printf("\t\tvideo_signal_type_present_flag = %d\n",
           (ulong)seqparm->vui->video_signal_type_present_flag);
    printf("\t\tvideo_format = %d\n",(ulong)seqparm->vui->video_format);
    printf("\t\tvideo_full_range_flag = %d\n",(ulong)seqparm->vui->video_full_range_flag);
    printf("\t\tcolour_description_present_flag = %d\n",
           (ulong)seqparm->vui->colour_description_present_flag);
    printf("\t\tcolour_primaries = %d\n",(ulong)seqparm->vui->colour_primaries);
    printf("\t\ttransfer_characteristics = %d\n",(ulong)seqparm->vui->transfer_characteristics);
    printf("\t\tmatrix_coefficients = %d\n",(ulong)seqparm->vui->matrix_coefficients);
    printf("\t\tchroma_loc_info_present_flag = %d\n",
           (ulong)seqparm->vui->chroma_loc_info_present_flag);
    printf("\t\tchroma_sample_loc_type_top_field = %d\n",
           (ulong)seqparm->vui->chroma_sample_loc_type_top_field);
    printf("\t\tchroma_sample_loc_type_bottom_field = %d\n",
           (ulong)seqparm->vui->chroma_sample_loc_type_bottom_field);
    printf("\t\ttiming_info_present_flag = %d\n",(ulong)seqparm->vui->timing_info_present_flag);
    if (seqparm->vui->timing_info_present_flag != 0) {
      printf("\t\tnum_units_in_tick = %d\n",(ulong)seqparm->vui->num_units_in_tick);
      printf("\t\ttime_scale = %d\n",(ulong)seqparm->vui->time_scale);
    }
    printf("\t\tfixed_frame_rate_flag = %d\n",(ulong)seqparm->vui->fixed_frame_rate_flag);
    if (seqparm->vui->nal_hrd_parameters != (h264_hrd_parameters *)0x0) {
      printf("\t\tNAL HRD parameters:\n");
      h264_print_hrd(seqparm->vui->nal_hrd_parameters);
    }
    if (seqparm->vui->vcl_hrd_parameters != (h264_hrd_parameters *)0x0) {
      printf("\t\tVCL HRD parameters:\n");
      h264_print_hrd(seqparm->vui->vcl_hrd_parameters);
    }
    if ((seqparm->vui->nal_hrd_parameters != (h264_hrd_parameters *)0x0) ||
       (seqparm->vui->vcl_hrd_parameters != (h264_hrd_parameters *)0x0)) {
      printf("\t\tlow_delay_hrd_flag = %d\n",(ulong)seqparm->vui->low_delay_hrd_flag);
    }
    printf("\t\tpic_struct_present_flag = %d\n",(ulong)seqparm->vui->pic_struct_present_flag);
    printf("\t\tbitstream_restriction_present_flag = %d\n",
           (ulong)seqparm->vui->bitstream_restriction_present_flag);
    printf("\t\tmotion_vectors_over_pic_bounduaries_flag = %d\n",
           (ulong)seqparm->vui->motion_vectors_over_pic_bounduaries_flag);
    printf("\t\tmax_bytes_per_pic_denom = %d\n",(ulong)seqparm->vui->max_bytes_per_pic_denom);
    printf("\t\tmax_bits_per_mb_denom = %d\n",(ulong)seqparm->vui->max_bits_per_mb_denom);
    printf("\t\tlog2_max_mv_length_horizontal = %d\n",
           (ulong)seqparm->vui->log2_max_mv_length_horizontal);
    printf("\t\tlog2_max_mv_length_vertical = %d\n",(ulong)seqparm->vui->log2_max_mv_length_vertical
          );
    printf("\t\tnum_reorder_frames = %d\n",(ulong)seqparm->vui->num_reorder_frames);
    printf("\t\tmax_dec_frame_buffering = %d\n",(ulong)seqparm->vui->max_dec_frame_buffering);
  }
  if (seqparm->is_svc != 0) {
    printf("\tinter_layer_deblocking_filter_control_present_flag = %d\n",
           (ulong)seqparm->inter_layer_deblocking_filter_control_present_flag);
    printf("\textended_spatial_scalability_idc = %d\n",
           (ulong)seqparm->extended_spatial_scalability_idc);
    printf("\tchroma_phase_x_plus1_flag = %d\n",(ulong)seqparm->chroma_phase_x_plus1_flag);
    printf("\tchroma_phase_y_plus1 = %d\n",(ulong)seqparm->chroma_phase_y_plus1);
    printf("\tseq_ref_layer_chroma_phase_x_plus1_flag = %d\n",
           (ulong)seqparm->seq_ref_layer_chroma_phase_x_plus1_flag);
    printf("\tseq_ref_layer_chroma_phase_y_plus1 = %d\n",
           (ulong)seqparm->seq_ref_layer_chroma_phase_y_plus1);
    printf("\tseq_ref_layer_left_offset = %d\n",(ulong)(uint)seqparm->seq_ref_layer_left_offset);
    printf("\tseq_ref_layer_top_offset = %d\n",(ulong)(uint)seqparm->seq_ref_layer_top_offset);
    printf("\tseq_ref_layer_right_offset = %d\n",(ulong)(uint)seqparm->seq_ref_layer_right_offset);
    printf("\tseq_ref_layer_bottom_offset = %d\n",(ulong)(uint)seqparm->seq_ref_layer_bottom_offset)
    ;
    printf("\tseq_tcoeff_level_prediction_flag = %d\n",
           (ulong)seqparm->seq_tcoeff_level_prediction_flag);
    printf("\tadaptive_tcoeff_level_prediction_flag = %d\n",
           (ulong)seqparm->adaptive_tcoeff_level_prediction_flag);
    printf("\tslice_header_restriction_flag = %d\n",(ulong)seqparm->slice_header_restriction_flag);
  }
  if (seqparm->is_mvc != 0) {
    printf("\tnum_views_minus1 = %d\n",(ulong)seqparm->num_views_minus1);
    for (k = 0; (uint)k <= seqparm->num_views_minus1; k = k + 1) {
      printf("\tview_id[%d] = %d\n",(ulong)(uint)k,(ulong)seqparm->views[k].view_id);
      printf("\tnum_anchor_refs_l0[%d] = %d\n",(ulong)(uint)k,
             (ulong)seqparm->views[k].num_anchor_refs_l0);
      for (local_20 = 1; local_20 < seqparm->views[k].num_anchor_refs_l0; local_20 = local_20 + 1) {
        printf("\tanchor_ref_l0[%d][%d] = %d\n",(ulong)(uint)k,(ulong)local_20,
               (ulong)seqparm->views[k].anchor_ref_l0[(int)local_20]);
      }
      printf("\tnum_anchor_refs_l1[%d] = %d\n",(ulong)(uint)k,
             (ulong)seqparm->views[k].num_anchor_refs_l1);
      for (local_20 = 1; local_20 < seqparm->views[k].num_anchor_refs_l1; local_20 = local_20 + 1) {
        printf("\tanchor_ref_l1[%d][%d] = %d\n",(ulong)(uint)k,(ulong)local_20,
               (ulong)seqparm->views[k].anchor_ref_l1[(int)local_20]);
      }
      printf("\tnum_non_anchor_refs_l0[%d] = %d\n",(ulong)(uint)k,
             (ulong)seqparm->views[k].num_non_anchor_refs_l0);
      for (local_20 = 1; local_20 < seqparm->views[k].num_non_anchor_refs_l0;
          local_20 = local_20 + 1) {
        printf("\tnon_anchor_ref_l0[%d][%d] = %d\n",(ulong)(uint)k,(ulong)local_20,
               (ulong)seqparm->views[k].non_anchor_ref_l0[(int)local_20]);
      }
      printf("\tnum_non_anchor_refs_l1[%d] = %d\n",(ulong)(uint)k,
             (ulong)seqparm->views[k].num_non_anchor_refs_l1);
      for (local_20 = 1; local_20 < seqparm->views[k].num_non_anchor_refs_l1;
          local_20 = local_20 + 1) {
        printf("\tnon_anchor_ref_l1[%d][%d] = %d\n",(ulong)(uint)k,(ulong)local_20,
               (ulong)seqparm->views[k].non_anchor_ref_l1[(int)local_20]);
      }
    }
    printf("\tnum_level_values_signalled_minus1 = %d\n",
           (ulong)seqparm->num_level_values_signalled_minus1);
    for (k = 0; (uint)k <= seqparm->num_level_values_signalled_minus1; k = k + 1) {
      printf("\tlevel_idc[%d] = %d.%d\n",(ulong)(uint)k,(ulong)(seqparm->levels[k].level_idc / 10),
             (ulong)seqparm->levels[k].level_idc % 10);
      printf("\tnum_applicable_ops_minus1[%d] = %d\n",(ulong)(uint)k,
             (ulong)seqparm->levels[k].num_applicable_ops_minus1);
      for (local_20 = 0; local_20 <= seqparm->levels[k].num_applicable_ops_minus1;
          local_20 = local_20 + 1) {
        phVar2 = seqparm->levels[k].applicable_ops + (int)local_20;
        printf("\tapplicable_op_temporal_id[%d][%d] = %d\n",(ulong)(uint)k,(ulong)local_20,
               (ulong)phVar2->temporal_id);
        printf("\tapplicable_op_num_target_views_minus1[%d][%d] = %d\n",(ulong)(uint)k,
               (ulong)local_20,(ulong)phVar2->num_target_views_minus1);
        for (op._4_4_ = 0; op._4_4_ <= phVar2->num_target_views_minus1; op._4_4_ = op._4_4_ + 1) {
          printf("\tapplicable_op_target_view_id[%d][%d][%d] = %d\n",(ulong)(uint)k,(ulong)local_20,
                 (ulong)op._4_4_,(ulong)phVar2->target_view_id[(int)op._4_4_]);
        }
        printf("\tapplicable_op_num_views_minus1[%d][%d] = %d\n",(ulong)(uint)k,(ulong)local_20,
               (ulong)phVar2->num_views_minus1);
      }
    }
  }
  return;
}

Assistant:

void h264_print_seqparm(struct h264_seqparm *seqparm) {
	printf("Sequence parameter set:\n");
	const char *profile_name = "???";
	switch (seqparm->profile_idc) {
		case H264_PROFILE_BASELINE:
			profile_name = "Baseline";
			break;
		case H264_PROFILE_MAIN:
			profile_name = "Main";
			break;
		case H264_PROFILE_EXTENDED:
			profile_name = "Extended";
			break;
		case H264_PROFILE_HIGH:
			profile_name = "High";
			break;
		case H264_PROFILE_HIGH_10:
			profile_name = "High 10";
			break;
		case H264_PROFILE_HIGH_422:
			profile_name = "High 4:2:2";
			break;
		case H264_PROFILE_HIGH_444:
			profile_name = "High 4:4:4";
			break;
		case H264_PROFILE_HIGH_444_PRED:
			profile_name = "High 4:4:4 Predictive";
			break;
		case H264_PROFILE_CAVLC_444:
			profile_name = "CAVLC 4:4:4";
			break;
		case H264_PROFILE_SCALABLE_BASELINE:
			profile_name = "Scalable Baseline";
			break;
		case H264_PROFILE_SCALABLE_HIGH:
			profile_name = "Scalable High";
			break;
		case H264_PROFILE_MULTIVIEW_HIGH:
			profile_name = "Multiview High";
			break;
		case H264_PROFILE_STEREO_HIGH:
			profile_name = "Stereo High";
			break;
	}
	printf ("\tprofile_idc = %d [%s]\n", seqparm->profile_idc, profile_name);
	printf ("\tconstraint_set =");
	int i, j, k;
	for (i = 7; i >= 0; i--)
		printf(" %d", seqparm->constraint_set >> i & 1);
	printf("\n");
	printf ("\tlevel_idc = %d.%d\n", seqparm->level_idc / 10, seqparm->level_idc % 10);
	printf ("\tseq_parameter_set_id = %d\n", seqparm->seq_parameter_set_id);
	printf ("\tchroma_format_idc = %d\n", seqparm->chroma_format_idc);
	printf ("\tseparate_colour_plane_flag = %d\n", seqparm->separate_colour_plane_flag);
	printf ("\tbit_depth_luma_minus8 = %d\n", seqparm->bit_depth_luma_minus8);
	printf ("\tbit_depth_chroma_minus8 = %d\n", seqparm->bit_depth_chroma_minus8);
	printf ("\tqpprime_y_zero_transform_bypass_flag = %d\n", seqparm->qpprime_y_zero_transform_bypass_flag);
	printf ("\tseq_scaling_matrix_present_flag = %d\n", seqparm->seq_scaling_matrix_present_flag);
	if (seqparm->seq_scaling_matrix_present_flag) {
		for (i = 0; i < (seqparm->chroma_format_idc == 3 ? 12 : 8); i++) {
			printf ("\tseq_scaling_list_present_flag[%d] = %d\n", i, seqparm->seq_scaling_list_present_flag[i]);
			if (seqparm->seq_scaling_list_present_flag[i]) {
				printf ("\tuse_default_scaling_matrix_flag[%d] = %d\n", i, seqparm->use_default_scaling_matrix_flag[i]);
				if (!seqparm->use_default_scaling_matrix_flag[i]) {
					for (j = 0; j < (i < 6 ? 16 : 64); j++) {
						if (i < 6)
							printf ("\tseq_scaling_list[%d][%d] = %d\n", i, j, seqparm->seq_scaling_list_4x4[i][j]);
						else
							printf ("\tseq_scaling_list[%d][%d] = %d\n", i, j, seqparm->seq_scaling_list_8x8[i-6][j]);
					}
				}
			}
		}
	}
	printf ("\tlog2_max_frame_num_minus4 = %d\n", seqparm->log2_max_frame_num_minus4);
	printf ("\tpic_order_cnt_type = %d\n", seqparm->pic_order_cnt_type);
	switch (seqparm->pic_order_cnt_type) {
		case 0:
			printf ("\tlog2_max_pic_order_cnt_lsb_minus4 = %d\n", seqparm->log2_max_pic_order_cnt_lsb_minus4);
			break;
		case 1:
			printf ("\tdelta_pic_order_always_zero_flag = %d\n", seqparm->delta_pic_order_always_zero_flag);
			printf ("\toffset_for_non_ref_pic = %d\n", seqparm->offset_for_non_ref_pic);
			printf ("\toffset_for_top_to_bottom_field = %d\n", seqparm->offset_for_top_to_bottom_field);
			printf ("\tnum_ref_frames_in_pic_order_cnt_cycle = %d\n", seqparm->num_ref_frames_in_pic_order_cnt_cycle);
			for (i = 0; i < seqparm->num_ref_frames_in_pic_order_cnt_cycle; i++) {
				printf("\toffset_for_ref_frame[%d] = %d\n", i, seqparm->offset_for_ref_frame[i]);
			}
			break;
	}
	printf ("\tmax_num_ref_frames = %d\n", seqparm->max_num_ref_frames);
	printf ("\tgaps_in_frame_num_value_allowed_flag = %d\n", seqparm->gaps_in_frame_num_value_allowed_flag);
	printf ("\tpic_width_in_mbs_minus1 = %d\n", seqparm->pic_width_in_mbs_minus1);
	printf ("\tpic_height_in_map_units_minus1 = %d\n", seqparm->pic_height_in_map_units_minus1);
	printf ("\tframe_mbs_only_flag = %d\n", seqparm->frame_mbs_only_flag);
	printf ("\tmb_adaptive_frame_field_flag = %d\n", seqparm->mb_adaptive_frame_field_flag);
	printf ("\tdirect_8x8_inference_flag = %d\n", seqparm->direct_8x8_inference_flag);
	printf ("\tframe_cropping_flag = %d\n", seqparm->frame_cropping_flag);
	printf ("\tframe_crop_left_offset = %d\n", seqparm->frame_crop_left_offset);
	printf ("\tframe_crop_right_offset = %d\n", seqparm->frame_crop_right_offset);
	printf ("\tframe_crop_top_offset = %d\n", seqparm->frame_crop_top_offset);
	printf ("\tframe_crop_bottom_offset = %d\n", seqparm->frame_crop_bottom_offset);
	if (seqparm->vui) {
		printf("\tVUI parameters:\n");
		printf("\t\taspect_ratio_present_flag = %d\n", seqparm->vui->aspect_ratio_present_flag);
		printf("\t\taspect_ratio_idc = %d\n", seqparm->vui->aspect_ratio_idc);
		printf("\t\tsar_width = %d\n", seqparm->vui->sar_width);
		printf("\t\tsar_height = %d\n", seqparm->vui->sar_height);
		printf("\t\toverscan_info_present_flag = %d\n", seqparm->vui->overscan_info_present_flag);
		if (seqparm->vui->overscan_info_present_flag) {
			printf("\t\toverscan_appropriate_flag = %d\n", seqparm->vui->overscan_appropriate_flag);
		}
		printf("\t\tvideo_signal_type_present_flag = %d\n", seqparm->vui->video_signal_type_present_flag);
		printf("\t\tvideo_format = %d\n", seqparm->vui->video_format);
		printf("\t\tvideo_full_range_flag = %d\n", seqparm->vui->video_full_range_flag);
		printf("\t\tcolour_description_present_flag = %d\n", seqparm->vui->colour_description_present_flag);
		printf("\t\tcolour_primaries = %d\n", seqparm->vui->colour_primaries);
		printf("\t\ttransfer_characteristics = %d\n", seqparm->vui->transfer_characteristics);
		printf("\t\tmatrix_coefficients = %d\n", seqparm->vui->matrix_coefficients);
		printf("\t\tchroma_loc_info_present_flag = %d\n", seqparm->vui->chroma_loc_info_present_flag);
		printf("\t\tchroma_sample_loc_type_top_field = %d\n", seqparm->vui->chroma_sample_loc_type_top_field);
		printf("\t\tchroma_sample_loc_type_bottom_field = %d\n", seqparm->vui->chroma_sample_loc_type_bottom_field);
		printf("\t\ttiming_info_present_flag = %d\n", seqparm->vui->timing_info_present_flag);
		if (seqparm->vui->timing_info_present_flag) {
			printf("\t\tnum_units_in_tick = %d\n", seqparm->vui->num_units_in_tick);
			printf("\t\ttime_scale = %d\n", seqparm->vui->time_scale);
		}
		printf("\t\tfixed_frame_rate_flag = %d\n", seqparm->vui->fixed_frame_rate_flag);
		if (seqparm->vui->nal_hrd_parameters) {
			printf("\t\tNAL HRD parameters:\n");
			h264_print_hrd(seqparm->vui->nal_hrd_parameters);
		}
		if (seqparm->vui->vcl_hrd_parameters) {
			printf("\t\tVCL HRD parameters:\n");
			h264_print_hrd(seqparm->vui->vcl_hrd_parameters);
		}
		if (seqparm->vui->nal_hrd_parameters || seqparm->vui->vcl_hrd_parameters) {
			printf("\t\tlow_delay_hrd_flag = %d\n", seqparm->vui->low_delay_hrd_flag);
		}
		printf("\t\tpic_struct_present_flag = %d\n", seqparm->vui->pic_struct_present_flag);
		printf("\t\tbitstream_restriction_present_flag = %d\n", seqparm->vui->bitstream_restriction_present_flag);
		printf("\t\tmotion_vectors_over_pic_bounduaries_flag = %d\n", seqparm->vui->motion_vectors_over_pic_bounduaries_flag);
		printf("\t\tmax_bytes_per_pic_denom = %d\n", seqparm->vui->max_bytes_per_pic_denom);
		printf("\t\tmax_bits_per_mb_denom = %d\n", seqparm->vui->max_bits_per_mb_denom);
		printf("\t\tlog2_max_mv_length_horizontal = %d\n", seqparm->vui->log2_max_mv_length_horizontal);
		printf("\t\tlog2_max_mv_length_vertical = %d\n", seqparm->vui->log2_max_mv_length_vertical);
		printf("\t\tnum_reorder_frames = %d\n", seqparm->vui->num_reorder_frames);
		printf("\t\tmax_dec_frame_buffering = %d\n", seqparm->vui->max_dec_frame_buffering);
	}
	if (seqparm->is_svc) {
		printf("\tinter_layer_deblocking_filter_control_present_flag = %d\n", seqparm->inter_layer_deblocking_filter_control_present_flag);
		printf("\textended_spatial_scalability_idc = %d\n", seqparm->extended_spatial_scalability_idc);
		printf("\tchroma_phase_x_plus1_flag = %d\n", seqparm->chroma_phase_x_plus1_flag);
		printf("\tchroma_phase_y_plus1 = %d\n", seqparm->chroma_phase_y_plus1);
		printf("\tseq_ref_layer_chroma_phase_x_plus1_flag = %d\n", seqparm->seq_ref_layer_chroma_phase_x_plus1_flag);
		printf("\tseq_ref_layer_chroma_phase_y_plus1 = %d\n", seqparm->seq_ref_layer_chroma_phase_y_plus1);
		printf("\tseq_ref_layer_left_offset = %d\n", seqparm->seq_ref_layer_left_offset);
		printf("\tseq_ref_layer_top_offset = %d\n", seqparm->seq_ref_layer_top_offset);
		printf("\tseq_ref_layer_right_offset = %d\n", seqparm->seq_ref_layer_right_offset);
		printf("\tseq_ref_layer_bottom_offset = %d\n", seqparm->seq_ref_layer_bottom_offset);
		printf("\tseq_tcoeff_level_prediction_flag = %d\n", seqparm->seq_tcoeff_level_prediction_flag);
		printf("\tadaptive_tcoeff_level_prediction_flag = %d\n", seqparm->adaptive_tcoeff_level_prediction_flag);
		printf("\tslice_header_restriction_flag = %d\n", seqparm->slice_header_restriction_flag);
		if (seqparm->svc_vui) {
			/* XXX */
		}
	}
	if (seqparm->is_mvc) {
		printf("\tnum_views_minus1 = %d\n", seqparm->num_views_minus1);
		for (i = 0; i <= seqparm->num_views_minus1; i++) {
			printf("\tview_id[%d] = %d\n", i, seqparm->views[i].view_id);
			printf("\tnum_anchor_refs_l0[%d] = %d\n", i, seqparm->views[i].num_anchor_refs_l0);
			for (j = 1; j < seqparm->views[i].num_anchor_refs_l0; j++)
				printf("\tanchor_ref_l0[%d][%d] = %d\n", i, j, seqparm->views[i].anchor_ref_l0[j]);
			printf("\tnum_anchor_refs_l1[%d] = %d\n", i, seqparm->views[i].num_anchor_refs_l1);
			for (j = 1; j < seqparm->views[i].num_anchor_refs_l1; j++)
				printf("\tanchor_ref_l1[%d][%d] = %d\n", i, j, seqparm->views[i].anchor_ref_l1[j]);
			printf("\tnum_non_anchor_refs_l0[%d] = %d\n", i, seqparm->views[i].num_non_anchor_refs_l0);
			for (j = 1; j < seqparm->views[i].num_non_anchor_refs_l0; j++)
				printf("\tnon_anchor_ref_l0[%d][%d] = %d\n", i, j, seqparm->views[i].non_anchor_ref_l0[j]);
			printf("\tnum_non_anchor_refs_l1[%d] = %d\n", i, seqparm->views[i].num_non_anchor_refs_l1);
			for (j = 1; j < seqparm->views[i].num_non_anchor_refs_l1; j++)
				printf("\tnon_anchor_ref_l1[%d][%d] = %d\n", i, j, seqparm->views[i].non_anchor_ref_l1[j]);
		}
		printf("\tnum_level_values_signalled_minus1 = %d\n", seqparm->num_level_values_signalled_minus1);
		for (i = 0; i <= seqparm->num_level_values_signalled_minus1; i++) {
			printf("\tlevel_idc[%d] = %d.%d\n", i, seqparm->levels[i].level_idc / 10, seqparm->levels[i].level_idc % 10);
			printf("\tnum_applicable_ops_minus1[%d] = %d\n", i, seqparm->levels[i].num_applicable_ops_minus1);
			for (j = 0; j <= seqparm->levels[i].num_applicable_ops_minus1; j++) {
				struct h264_seqparm_mvc_applicable_op *op = &seqparm->levels[i].applicable_ops[j];
				printf("\tapplicable_op_temporal_id[%d][%d] = %d\n", i, j, op->temporal_id);
				printf("\tapplicable_op_num_target_views_minus1[%d][%d] = %d\n", i, j, op->num_target_views_minus1);
				for (k = 0; k <= op->num_target_views_minus1; k++)
					printf("\tapplicable_op_target_view_id[%d][%d][%d] = %d\n", i, j, k, op->target_view_id[k]);
				printf("\tapplicable_op_num_views_minus1[%d][%d] = %d\n", i, j, op->num_views_minus1);
			}
		}
		if (seqparm->mvc_vui) {
			/* XXX */
		}
	}
}